

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O0

void flatbuffers::tests::Offset64Test(void)

{
  bool expval;
  return_type rVar1;
  return_type rVar2;
  uint expval_00;
  size_t buffer_minalign;
  reference pvVar3;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> OVar4;
  Offset64<flatbuffers::String> OVar5;
  uint8_t *puVar6;
  SizeT buf_len;
  RootTable *this;
  Vector<unsigned_char,_unsigned_int> *pVVar7;
  String *pSVar8;
  char *pcVar9;
  Vector64<uint8_t> *pVVar10;
  unsigned_long expval_01;
  RootTable *root_table;
  Verifier verifier;
  Options options;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_148;
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_> local_13c;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> local_138;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> local_130;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_128;
  Offset<flatbuffers::String> local_11c;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_118;
  Offset64<flatbuffers::String> local_110;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_108;
  offset_type local_100;
  offset_type local_fc;
  Offset<RootTable> root_table_offset;
  Offset<flatbuffers::String> near_string_offset;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> big_vector_offset;
  Offset64<flatbuffers::String> far_string_offset;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> far_vector_offset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> big_data;
  undefined1 local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> far_data;
  size_t big_vector_size;
  size_t far_vector_size;
  FlatBufferBuilder64 builder;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<true>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)&far_vector_size,0x400,(Allocator *)0x0,false,
             buffer_minalign);
  far_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,4);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,0);
  *pvVar3 = '\x04';
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,3);
  *pvVar3 = '\x02';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&far_vector_offset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&far_vector_offset,4);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&far_vector_offset,0)
  ;
  *pvVar3 = '\b';
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&far_vector_offset,3)
  ;
  *pvVar3 = '\x03';
  OVar4 = FlatBufferBuilderImpl<true>::CreateVector64<flatbuffers::Vector,_unsigned_char>
                    ((FlatBufferBuilderImpl<true> *)&far_vector_size,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  OVar5 = FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset64>
                    ((FlatBufferBuilderImpl<true> *)&far_vector_size,"some far string");
  _root_table_offset =
       FlatBufferBuilderImpl<true>::CreateVector64<flatbuffers::Vector64,_unsigned_char>
                 ((FlatBufferBuilderImpl<true> *)&far_vector_size,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&far_vector_offset);
  local_11c = FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset>
                        ((FlatBufferBuilderImpl<true> *)&far_vector_size,"some near string");
  local_118.o = _root_table_offset;
  local_110 = OVar5;
  local_108 = OVar4;
  local_fc = local_11c.o;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_128,0);
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>::Offset64(&local_130,0);
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>::Offset64(&local_138,0);
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>::Offset
            (&local_13c,0);
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_148,0);
  local_100 = (offset_type)
              CreateRootTable((FlatBufferBuilder64 *)&far_vector_size,local_108,0,local_110,
                              local_118,local_11c,local_128,local_130,local_138,local_13c,local_148)
  ;
  FlatBufferBuilderImpl<true>::Finish<RootTable>
            ((FlatBufferBuilderImpl<true> *)&far_vector_size,(Offset<RootTable>)local_100,
             (char *)0x0);
  VerifierTemplate<false>::Options::Options((Options *)&verifier.flex_reuse_tracker_);
  std::numeric_limits<long>::max();
  puVar6 = FlatBufferBuilderImpl<true>::GetBufferPointer
                     ((FlatBufferBuilderImpl<true> *)&far_vector_size);
  buf_len = FlatBufferBuilderImpl<true>::GetSize((FlatBufferBuilderImpl<true> *)&far_vector_size);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&root_table,puVar6,buf_len,
             (Options *)&verifier.flex_reuse_tracker_);
  expval = VerifyRootTableBuffer((Verifier *)&root_table);
  TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x48,"");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&far_vector_offset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  puVar6 = FlatBufferBuilderImpl<true>::GetBufferPointer
                     ((FlatBufferBuilderImpl<true> *)&far_vector_size);
  this = GetRootTable(puVar6);
  pVVar7 = RootTable::far_vector(this);
  expval_00 = Vector<unsigned_char,_unsigned_int>::size(pVVar7);
  TestEq<unsigned_int,unsigned_long>
            (expval_00,4,"\'root_table->far_vector()->size()\' != \'far_vector_size\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x4f,"");
  pVVar7 = RootTable::far_vector(this);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,0);
  TestEq<unsigned_char,int>
            (rVar1,4,"\'root_table->far_vector()->Get(0)\' != \'4\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x50,"");
  pVVar7 = RootTable::far_vector(this);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,3);
  TestEq<unsigned_char,int>
            (rVar1,2,"\'root_table->far_vector()->Get(far_vector_size - 1)\' != \'2\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x51,"");
  pSVar8 = RootTable::far_string(this);
  pcVar9 = String::c_str(pSVar8);
  TestEqStr(pcVar9,"some far string",
            "\'root_table->far_string()->c_str()\' != \'\"some far string\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0x53,"");
  pVVar10 = RootTable::big_vector(this);
  expval_01 = Vector<unsigned_char,_unsigned_long>::size(pVVar10);
  TestEq<unsigned_long,unsigned_long>
            (expval_01,4,"\'root_table->big_vector()->size()\' != \'big_vector_size\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x56,"");
  pVVar10 = RootTable::big_vector(this);
  rVar2 = Vector<unsigned_char,_unsigned_long>::Get(pVVar10,0);
  TestEq<unsigned_char,int>
            (rVar2,8,"\'root_table->big_vector()->Get(0)\' != \'8\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x57,"");
  pVVar10 = RootTable::big_vector(this);
  rVar2 = Vector<unsigned_char,_unsigned_long>::Get(pVVar10,3);
  TestEq<unsigned_char,int>
            (rVar2,3,"\'root_table->big_vector()->Get(big_vector_size - 1)\' != \'3\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x58,"");
  pSVar8 = RootTable::near_string(this);
  pcVar9 = String::c_str(pSVar8);
  TestEqStr(pcVar9,"some near string",
            "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0x5a,"");
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)&far_vector_size);
  return;
}

Assistant:

void Offset64Test() {
  FlatBufferBuilder64 builder;

  const size_t far_vector_size = 1LL << 2;
  // Make a large number if wanting to test a real large buffer.
  const size_t big_vector_size = 1LL << 2;

  {
    // First create the vectors that will be copied to the buffer.
    std::vector<uint8_t> far_data;
    far_data.resize(far_vector_size);
    far_data[0] = 4;
    far_data[far_vector_size - 1] = 2;

    std::vector<uint8_t> big_data;
    big_data.resize(big_vector_size);
    big_data[0] = 8;
    big_data[big_vector_size - 1] = 3;

    // Then serialize all the fields that have 64-bit offsets, as these must be
    // serialized before any 32-bit fields are added to the buffer.
    const Offset64<Vector<uint8_t>> far_vector_offset =
        builder.CreateVector64<Vector>(far_data);

    const Offset64<String> far_string_offset =
        builder.CreateString<Offset64>("some far string");

    const Offset64<Vector64<uint8_t>> big_vector_offset =
        builder.CreateVector64(big_data);

    // Now that we are done with the 64-bit fields, we can create and add the
    // normal fields.
    const Offset<String> near_string_offset =
        builder.CreateString("some near string");

    // Finish by building the root table by passing in all the offsets.
    const Offset<RootTable> root_table_offset =
        CreateRootTable(builder, far_vector_offset, 0, far_string_offset,
                        big_vector_offset, near_string_offset);

    // Finish the buffer.
    builder.Finish(root_table_offset);

    Verifier::Options options;
    // Allow the verifier to verify 64-bit buffers.
    options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
    options.assert = true;

    Verifier verifier(builder.GetBufferPointer(), builder.GetSize(), options);

    TEST_EQ(VerifyRootTableBuffer(verifier), true);
  }

  {
    const RootTable *root_table = GetRootTable(builder.GetBufferPointer());

    // Expect the far vector to be properly sized.
    TEST_EQ(root_table->far_vector()->size(), far_vector_size);
    TEST_EQ(root_table->far_vector()->Get(0), 4);
    TEST_EQ(root_table->far_vector()->Get(far_vector_size - 1), 2);

    TEST_EQ_STR(root_table->far_string()->c_str(), "some far string");

    // Expect the big vector to be properly sized.
    TEST_EQ(root_table->big_vector()->size(), big_vector_size);
    TEST_EQ(root_table->big_vector()->Get(0), 8);
    TEST_EQ(root_table->big_vector()->Get(big_vector_size - 1), 3);

    TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");
  }
}